

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestStreamWriterTestdropNullPlaceholders::~TestStreamWriterTestdropNullPlaceholders
          (TestStreamWriterTestdropNullPlaceholders *this)

{
  void *in_RDI;
  
  ~TestStreamWriterTestdropNullPlaceholders((TestStreamWriterTestdropNullPlaceholders *)0x16baf8);
  operator_delete(in_RDI);
  return;
}

Assistant:

JSONTEST_FIXTURE(StreamWriterTest, dropNullPlaceholders) {
  Json::StreamWriterBuilder b;
  Json::Value nullValue;
  b.settings_["dropNullPlaceholders"] = false;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "null");
  b.settings_["dropNullPlaceholders"] = true;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "");
}